

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::GreaterThanTest<char,unsigned_long_long>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2b;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2a;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_29;
  int local_28 [4];
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  
  local_28[3] = 3;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_29,local_28 + 3);
  if (local_29.m_int < '\x02') {
    local_28[2] = 4;
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_2a,local_28 + 2);
    if ('\x05' < local_2a.m_int) {
      local_28[1] = 6;
      SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_2b,local_28 + 1);
      local_28[0] = 7;
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<int>(&local_18,local_28);
      return local_18.m_int < (byte)local_2b.m_int && -1 < local_2b.m_int;
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool GreaterThanTest()
	{
		return
			(U)2 > SafeInt<T>(3) &&
			SafeInt<T>(4) > (U)5 &&
			SafeInt<T>(6) > SafeInt<U>(7);
	}